

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void encodeImagePackBits(string *path)

{
  uchar *__args;
  uchar uVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  uchar *puVar5;
  long *plVar6;
  FILE *__s;
  long *plVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPixels;
  vector<char,_std::allocator<char>_> occurence;
  int height;
  int width;
  string outputPath;
  int maximum;
  char pSix [10];
  void *local_e8;
  iterator iStack_e0;
  uchar *local_d8;
  vector<char,_std::allocator<char>_> local_c8;
  int local_b0;
  int local_ac;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  int local_84;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  char local_3a [10];
  
  local_ac = 0;
  local_b0 = 0;
  local_84 = 0;
  pcVar3 = (path->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + path->_M_string_length);
  puVar5 = readPPM(&local_60,local_3a,&local_ac,&local_b0,&local_84);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_e8 = (void *)0x0;
  iStack_e0._M_current = (uchar *)0x0;
  iVar8 = 0;
  local_d8 = (uchar *)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  if (0 < local_ac * local_b0 * 3) {
    puVar5 = puVar5 + 2;
    bVar4 = true;
    do {
      __args = puVar5 + -2;
      if (bVar4) {
        if (iStack_e0._M_current == local_d8) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                     __args);
        }
        else {
          *iStack_e0._M_current = *__args;
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
        if (iStack_e0._M_current == local_d8) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                     puVar5 + -1);
        }
        else {
          *iStack_e0._M_current = puVar5[-1];
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
        if (iStack_e0._M_current == local_d8) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                     puVar5);
        }
        else {
          *iStack_e0._M_current = *puVar5;
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
        local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
        if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(char *)&local_a8);
        }
        else {
          *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = '\0';
          local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        bVar4 = false;
      }
      else {
        uVar1 = *__args;
        if (((uVar1 == iStack_e0._M_current[-3]) && (puVar5[-1] == iStack_e0._M_current[-2])) &&
           (*puVar5 == iStack_e0._M_current[-1])) {
          cVar2 = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          if (cVar2 < '\x01') {
            if (cVar2 == -0x7f) {
              if (iStack_e0._M_current == local_d8) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,
                           iStack_e0,__args);
              }
              else {
                *iStack_e0._M_current = uVar1;
                iStack_e0._M_current = iStack_e0._M_current + 1;
              }
              if (iStack_e0._M_current == local_d8) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,
                           iStack_e0,puVar5 + -1);
              }
              else {
                *iStack_e0._M_current = puVar5[-1];
                iStack_e0._M_current = iStack_e0._M_current + 1;
              }
              if (iStack_e0._M_current == local_d8) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,
                           iStack_e0,puVar5);
              }
              else {
                *iStack_e0._M_current = *puVar5;
                iStack_e0._M_current = iStack_e0._M_current + 1;
              }
              local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
              if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00102f6a;
              std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,(char *)&local_a8);
            }
            else {
              local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] = cVar2 + -1;
            }
          }
          else {
            local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish[-1] = cVar2 + -1;
            local_a8 = (long *)CONCAT71(local_a8._1_7_,0xff);
            if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,(char *)&local_a8);
            }
            else {
              *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish = -1;
LAB_00102f6d:
              local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        else {
          if (iStack_e0._M_current == local_d8) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                       __args);
          }
          else {
            *iStack_e0._M_current = uVar1;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          if (iStack_e0._M_current == local_d8) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                       puVar5 + -1);
          }
          else {
            *iStack_e0._M_current = puVar5[-1];
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          if (iStack_e0._M_current == local_d8) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,iStack_e0,
                       puVar5);
          }
          else {
            *iStack_e0._M_current = *puVar5;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          if ((byte)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1] < 0x7f) {
            local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish[-1] =
                 local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1] + 1;
          }
          else {
            local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
            if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
LAB_00102f6a:
              *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish = '\0';
              goto LAB_00102f6d;
            }
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char *)&local_a8);
          }
        }
      }
      puVar5 = puVar5 + 3;
      iVar8 = iVar8 + 3;
    } while (iVar8 < local_ac * local_b0 * 3);
  }
  local_a8 = (long *)CONCAT71(local_a8._1_7_,0x80);
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&local_c8,
               (iterator)
               local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_a8);
  }
  else {
    *local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = -0x80;
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::__cxx11::string::substr((ulong)local_80,(ulong)path);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_98 = *plVar7;
    lStack_90 = plVar6[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar7;
    local_a8 = (long *)*plVar6;
  }
  local_a0 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  __s = fopen((char *)local_a8,"wb");
  fwrite(&local_ac,1,4,__s);
  fwrite(&local_b0,1,4,__s);
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar10 = 0;
    uVar9 = 0;
    do {
      fputc((int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10],__s);
      iVar8 = (int)uVar9;
      if ((byte)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] < 0x81) {
        if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar10] < '\0') break;
        if (-1 < local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10]) {
          uVar9 = (ulong)iVar8;
          iVar8 = -1;
          do {
            fwrite((void *)((long)local_e8 + uVar9),1,3,__s);
            uVar9 = uVar9 + 3;
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10]);
        }
      }
      else {
        fwrite((void *)((long)local_e8 + (long)iVar8),1,3,__s);
        uVar9 = (ulong)(iVar8 + 3);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start));
  }
  fclose(__s);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8);
  }
  return;
}

Assistant:

void encodeImagePackBits(std::string path)
{
    char pSix[10];		// indicates this is a PPM image
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    // read the PPM file and store its contents inside an array and return the pointer to that array to pixelArray
    unsigned char* pixelArray = readPPM(path, pSix, width, height, maximum);
    std::vector <unsigned char> encodedPixels;
    std::vector <char> occurence;

    bool first = true;

    for (int i = 0; i < width * height * 3; i+=3)
    {
        if (first)
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);
            occurence.push_back(0);
            first = false;
            continue;
        }

        bool same = pixelArray[i] == encodedPixels[encodedPixels.size() - 3]
                    && pixelArray[i+1] == encodedPixels[encodedPixels.size() - 2]
                    && pixelArray[i+2] == encodedPixels[encodedPixels.size() - 1];

        if (same)
        {
            if (occurence.back() <= 0)
            {
                if (occurence.back() == -127)
                {
                    encodedPixels.push_back(pixelArray[i]);
                    encodedPixels.push_back(pixelArray[i+1]);
                    encodedPixels.push_back(pixelArray[i+2]);
                    occurence.push_back(0);
                }
                else
                    occurence.back()--;
            }
            else
            {
                occurence.back()--;
                occurence.push_back(-1);
            }
        }
        else
        {
            encodedPixels.push_back(pixelArray[i]);
            encodedPixels.push_back(pixelArray[i+1]);
            encodedPixels.push_back(pixelArray[i+2]);

            if (occurence.back() < 0 || occurence.back() == 127)
                occurence.push_back(0);
            else
                occurence.back()++;
        }
    }
    occurence.push_back(-128);

    string outputPath = path.substr(0, path.size()-4) + "_packbits.rle";
    FILE *fp = fopen(outputPath.c_str(), "wb");
    fwrite(&width, 1, sizeof(int), fp);
    fwrite(&height, 1, sizeof(int), fp);

    int pixelCounter = 0;
    for (int i = 0; i < occurence.size(); i++)
    {
        fwrite(&occurence[i], 1, 1, fp);
        // if n is negative, we have to  repeat 1 - n times
        if (occurence[i] < 0 && occurence[i] != -128)
        {
            fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
            pixelCounter+=3;
        }
        else if (occurence[i] >= 0)
        {
            for (int k = 0; k < occurence[i] + 1; k++)
            {
                fwrite(&encodedPixels[pixelCounter], 1, 3, fp);
                pixelCounter+=3;
            }
        }
        else
        {
            break;
        }
    }
    fclose(fp);
}